

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::toDimacs(Solver *this,FILE *f,vec<Minisat::Lit> *assumps)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  bool bVar4;
  Var VVar5;
  Clause CVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  anon_struct_8_10_eb538618_for_header *c;
  ulong uVar13;
  Var max;
  uint local_4c;
  vec<int> local_48;
  FILE *local_38;
  
  if (this->ok == false) {
    fwrite("p cnf 1 2\n1 0\n-1 0\n",0x13,1,(FILE *)f);
    return;
  }
  local_48.data = (int *)0x0;
  local_48.sz = 0;
  local_48.cap = 0;
  local_4c = 0;
  iVar11 = (this->clauses).sz;
  uVar13 = (ulong)iVar11;
  if ((long)uVar13 < 1) {
    iVar9 = 0;
    uVar13 = 0;
  }
  else {
    puVar2 = (this->clauses).data;
    puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
    uVar12 = 0;
    iVar9 = 0;
    local_38 = (FILE *)f;
    do {
      bVar4 = satisfied(this,(Clause *)(puVar3 + puVar2[uVar12]));
      iVar9 = iVar9 + (uint)!bVar4;
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
    if (iVar11 < 1) {
      uVar13 = 0;
      f = (FILE *)local_38;
    }
    else {
      lVar8 = 0;
      do {
        c = (anon_struct_8_10_eb538618_for_header *)
            ((this->ca).super_RegionAllocator<unsigned_int>.memory + (this->clauses).data[lVar8]);
        bVar4 = satisfied(this,(Clause *)c);
        if ((!bVar4) && (CVar6.header = *c, (ulong)CVar6.header >> 0x22 != 0)) {
          uVar13 = 0;
          do {
            iVar11 = *(int *)(&c[1].field_0x0 + uVar13 * 4) >> 1;
            if (((byte)*(int *)(&c[1].field_0x0 + uVar13 * 4) & 1 ^
                (this->assigns).data[iVar11].value) != 1) {
              mapVar(iVar11,&local_48,(Var *)&local_4c);
              CVar6.header = *c;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < (ulong)CVar6.header >> 0x22);
          uVar13 = (ulong)(uint)(this->clauses).sz;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (int)uVar13);
      uVar13 = (ulong)local_4c;
      f = (FILE *)local_38;
    }
  }
  uVar10 = iVar9 + (this->assumptions).sz;
  fprintf((FILE *)f,"p cnf %d %d\n",uVar13,(ulong)uVar10);
  if (0 < (this->assumptions).sz) {
    lVar8 = 0;
    do {
      uVar1 = (this->assumptions).data[lVar8].x;
      VVar5 = mapVar((int)uVar1 >> 1,&local_48,(Var *)&local_4c);
      pcVar7 = "-";
      if ((uVar1 & 1) == 0) {
        pcVar7 = "";
      }
      fprintf((FILE *)f,"%s%d 0\n",pcVar7,(ulong)(VVar5 + 1));
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->assumptions).sz);
  }
  if (0 < (this->clauses).sz) {
    lVar8 = 0;
    do {
      toDimacs(this,f,(Clause *)
                      ((this->ca).super_RegionAllocator<unsigned_int>.memory +
                      (this->clauses).data[lVar8]),&local_48,(Var *)&local_4c);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->clauses).sz);
  }
  if (0 < this->verbosity) {
    printf("c Wrote DIMACS with %d variables and %d clauses.\n",(ulong)local_4c,(ulong)uVar10);
  }
  if (local_48.data != (int *)0x0) {
    local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
    free(local_48.data);
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE *f, const vec<Lit> &assumps)
{
    // Handle case when solver is in contradictory state:
    if (!ok) {
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return;
    }

    vec<Var> map;
    Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int cnt = 0;
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])) cnt++;

    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])) {
            Clause &c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (value(c[j]) != l_False) mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumptions.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for (int i = 0; i < assumptions.size(); i++) {
        assert(value(assumptions[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumptions[i]) ? "-" : "", mapVar(var(assumptions[i]), map, max) + 1);
    }

    for (int i = 0; i < clauses.size(); i++) toDimacs(f, ca[clauses[i]], map, max);

    if (verbosity > 0) printf("c Wrote DIMACS with %d variables and %d clauses.\n", max, cnt);
}